

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::HasLazyFields(FileDescriptor *file,Options *options)

{
  long lVar1;
  once_flag *__once;
  bool bVar2;
  long lVar3;
  long lVar4;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  if (0 < *(int *)(file + 0x2c)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      bVar2 = HasLazyFields((Descriptor *)(*(long *)(file + 0x68) + lVar4),options);
      if (bVar2) {
        return true;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x90;
    } while (lVar3 < *(int *)(file + 0x2c));
  }
  if (0 < *(int *)(file + 0x38)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      lVar1 = *(long *)(file + 0x80);
      if ((*(char *)(*(long *)(lVar1 + 0x78 + lVar4) + 0x4d) == '\x01') &&
         (*(int *)(lVar1 + 0x3c + lVar4) != 3)) {
        __once = *(once_flag **)(lVar1 + 0x30 + lVar4);
        if (__once != (once_flag *)0x0) {
          local_40 = (FieldDescriptor *)(lVar1 + lVar4);
          local_38 = FieldDescriptor::TypeOnceInit;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (__once,&local_38,&local_40);
        }
        if (*(int *)(lVar1 + 0x38 + lVar4) == 0xb) {
          if (options->enforce_mode == kSpeed) {
            if (options->opensource_runtime != true) {
              return true;
            }
          }
          else if (((options->enforce_mode != kLiteRuntime) &&
                   (*(int *)(*(long *)(*(long *)(lVar1 + 0x28 + lVar4) + 0x88) + 0xa4) != 3)) &&
                  ((options->opensource_runtime & 1U) == 0)) {
            return true;
          }
        }
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x98;
    } while (lVar3 < *(int *)(file + 0x38));
  }
  return false;
}

Assistant:

bool HasLazyFields(const FileDescriptor* file, const Options& options) {
  for (int i = 0; i < file->message_type_count(); i++) {
    const Descriptor* descriptor(file->message_type(i));
    if (HasLazyFields(descriptor, options)) {
      return true;
    }
  }
  for (int field_idx = 0; field_idx < file->extension_count(); field_idx++) {
    if (IsLazy(file->extension(field_idx), options)) {
      return true;
    }
  }
  return false;
}